

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O1

void aalcalcmeanonly::OutputRows(bool skipHeader,bool ordOutput,string *parquetOutFile)

{
  _Rb_tree_node_base *p_Var1;
  char *__s;
  long lVar2;
  
  if (parquetOutFile->_M_string_length == 0 || ordOutput) {
    if (!skipHeader) {
      __s = "summary_id,type,mean";
      if (ordOutput) {
        __s = "SummaryId,SampleType,MeanLoss";
      }
      puts(__s);
    }
    p_Var1 = (_Rb_tree_node_base *)means_._24_8_;
    if (means_._24_8_ != 0x108248) {
      do {
        lVar2 = 0;
        do {
          printf("%d,%ld,%f\n",*(double *)((long)&p_Var1[1]._M_parent + lVar2) / (double)nPeriods_,
                 (ulong)p_Var1[1]._M_color,(lVar2 >> 3) + 1);
          lVar2 = lVar2 + 8;
        } while (lVar2 != 0x10);
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      } while (p_Var1 != (_Rb_tree_node_base *)(means_ + 8));
    }
  }
  return;
}

Assistant:

void OutputRows(const bool skipHeader, const bool ordOutput,
		  const std::string& parquetOutFile) {
  /* !parquetOutfile.empty() | ordOutput | output files
  * ---------------------------------------------------
  *            1             |     1     | ORD parquet and csv
  *            1             |     0     | ORD parquet
  *            0             |     1     | ORD csv
  *            0             |     0     | legacy csv
  */

    if (!(!parquetOutFile.empty() && !ordOutput)) {
      WriteCsvOutputFile(skipHeader, ordOutput);
    }

#ifdef HAVE_PARQUET
    if (!parquetOutFile.empty()) WriteParquetOutputFile(parquetOutFile);
#endif

  }